

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::Builder::SaveTo(Builder *this,Version *v)

{
  VersionSet *pVVar1;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __last;
  FileSet *pFVar2;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  _Var3;
  _Rb_tree_node_base *p_Var4;
  int level;
  int level_00;
  long lVar5;
  __normal_iterator<leveldb::FileMetaData_*const_*,_std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>_>
  __first;
  
  pVVar1 = this->vset_;
  lVar5 = 0;
  do {
    __first._M_current =
         this->base_->files_[lVar5].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    __last._M_current =
         this->base_->files_[lVar5].
         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    pFVar2 = this->levels_[lVar5].added_files;
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::reserve
              (v->files_ + lVar5,
               ((long)__last._M_current - (long)__first._M_current >> 3) +
               (pFVar2->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
    level_00 = (int)lVar5;
    for (p_Var4 = (pFVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(pFVar2->_M_t)._M_impl.super__Rb_tree_header;
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
      _Var3 = std::
              __upper_bound<__gnu_cxx::__normal_iterator<leveldb::FileMetaData*const*,std::vector<leveldb::FileMetaData*,std::allocator<leveldb::FileMetaData*>>>,leveldb::FileMetaData*,__gnu_cxx::__ops::_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>>
                        (__first,__last,(FileMetaData **)(p_Var4 + 1),
                         (_Val_comp_iter<leveldb::VersionSet::Builder::BySmallestKey>)&pVVar1->icmp_
                        );
      for (; __first._M_current != _Var3._M_current; __first._M_current = __first._M_current + 1) {
        MaybeAddFile(this,v,level_00,*__first._M_current);
      }
      MaybeAddFile(this,v,level_00,*(FileMetaData **)(p_Var4 + 1));
    }
    for (; __first._M_current != __last._M_current; __first._M_current = __first._M_current + 1) {
      MaybeAddFile(this,v,level_00,*__first._M_current);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 7);
  return;
}

Assistant:

void SaveTo(Version* v) {
    BySmallestKey cmp;
    cmp.internal_comparator = &vset_->icmp_;
    for (int level = 0; level < config::kNumLevels; level++) {
      // Merge the set of added files with the set of pre-existing files.
      // Drop any deleted files.  Store the result in *v.
      const std::vector<FileMetaData*>& base_files = base_->files_[level];
      std::vector<FileMetaData*>::const_iterator base_iter = base_files.begin();
      std::vector<FileMetaData*>::const_iterator base_end = base_files.end();
      const FileSet* added_files = levels_[level].added_files;
      v->files_[level].reserve(base_files.size() + added_files->size());
      for (const auto& added_file : *added_files) {
        // Add all smaller files listed in base_
        for (std::vector<FileMetaData*>::const_iterator bpos =
                 std::upper_bound(base_iter, base_end, added_file, cmp);
             base_iter != bpos; ++base_iter) {
          MaybeAddFile(v, level, *base_iter);
        }

        MaybeAddFile(v, level, added_file);
      }

      // Add remaining base files
      for (; base_iter != base_end; ++base_iter) {
        MaybeAddFile(v, level, *base_iter);
      }

#ifndef NDEBUG
      // Make sure there is no overlap in levels > 0
      if (level > 0) {
        for (uint32_t i = 1; i < v->files_[level].size(); i++) {
          const InternalKey& prev_end = v->files_[level][i - 1]->largest;
          const InternalKey& this_begin = v->files_[level][i]->smallest;
          if (vset_->icmp_.Compare(prev_end, this_begin) >= 0) {
            fprintf(stderr, "overlapping ranges in same level %s vs. %s\n",
                    prev_end.DebugString().c_str(),
                    this_begin.DebugString().c_str());
            abort();
          }
        }
      }
#endif
    }
  }